

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitSwitchExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,SwitchExpr *expr)

{
  string *psVar1;
  undefined1 *puVar2;
  Expr *pEVar3;
  pointer pSVar4;
  _Head_base<0UL,_enact::Pattern_*,_false> _Var5;
  BlockExpr *pBVar6;
  ostream *poVar7;
  pointer pSVar8;
  string local_1f8 [32];
  string local_1d8 [32];
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  psVar1 = &this->m_ident;
  poVar7 = std::operator<<(local_1a8,(string *)psVar1);
  poVar7 = std::operator<<(poVar7,"(Expr::Switch ");
  puVar2 = &this->field_0x8;
  pEVar3 = (expr->value)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar3->_vptr_Expr[2])(local_1f8,pEVar3,puVar2);
  poVar7 = std::operator<<(poVar7,local_1f8);
  std::operator<<(poVar7," (\n");
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::append((char *)psVar1);
  pSVar4 = (expr->cases).super__Vector_base<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar8 = (expr->cases).
                super__Vector_base<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar8 != pSVar4; pSVar8 = pSVar8 + 1) {
    poVar7 = std::operator<<(local_1a8,(string *)psVar1);
    poVar7 = std::operator<<(poVar7,"(");
    _Var5._M_head_impl =
         (pSVar8->pattern)._M_t.
         super___uniq_ptr_impl<enact::Pattern,_std::default_delete<enact::Pattern>_>._M_t.
         super__Tuple_impl<0UL,_enact::Pattern_*,_std::default_delete<enact::Pattern>_>.
         super__Head_base<0UL,_enact::Pattern_*,_false>._M_head_impl;
    (*(_Var5._M_head_impl)->_vptr_Pattern[2])(local_1f8,_Var5._M_head_impl,&this->field_0x10);
    poVar7 = std::operator<<(poVar7,local_1f8);
    poVar7 = std::operator<<(poVar7," ");
    pEVar3 = (pSVar8->predicate)._M_t.
             super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
             super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
             super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
    (*pEVar3->_vptr_Expr[2])(local_1d8,pEVar3,puVar2);
    poVar7 = std::operator<<(poVar7,local_1d8);
    std::operator<<(poVar7," (\n");
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::append((char *)psVar1);
    pBVar6 = (pSVar8->body)._M_t.
             super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
             super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
             super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
    (*(pBVar6->super_Expr)._vptr_Expr[2])(local_1f8,pBVar6,puVar2);
    std::operator<<(local_1a8,local_1f8);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::erase((ulong)psVar1,0);
    poVar7 = std::operator<<(local_1a8,(string *)psVar1);
    std::operator<<(poVar7,")\n");
  }
  std::__cxx11::string::erase((ulong)psVar1,0);
  poVar7 = std::operator<<(local_1a8,(string *)psVar1);
  std::operator<<(poVar7,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitSwitchExpr(SwitchExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::Switch " << visitExpr(*expr.value) << " (\n";
        m_ident += "    ";

        for (auto &case_ : expr.cases) {
            s << m_ident << "(" << visitPattern(*case_.pattern) << " " <<
                    visitExpr(*case_.predicate) << " (\n";
            m_ident += "    ";

            s << visitExpr(*case_.body);

            m_ident.erase(0, 4);
            s << m_ident << ")\n";
        }

        m_ident.erase(0, 4);
        s << m_ident << ")";

        return s.str();
    }